

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSharedPtr.hpp
# Opt level: O0

void __thiscall
de::
SharedPtrState<vk::refdetails::Unique<vk::Handle<(vk::HandleType)12>_>,_de::DefaultDeleter<vk::refdetails::Unique<vk::Handle<(vk::HandleType)12>_>_>_>
::deletePtr(SharedPtrState<vk::refdetails::Unique<vk::Handle<(vk::HandleType)12>_>,_de::DefaultDeleter<vk::refdetails::Unique<vk::Handle<(vk::HandleType)12>_>_>_>
            *this)

{
  SharedPtrState<vk::refdetails::Unique<vk::Handle<(vk::HandleType)12>_>,_de::DefaultDeleter<vk::refdetails::Unique<vk::Handle<(vk::HandleType)12>_>_>_>
  *this_local;
  
  DefaultDeleter<vk::refdetails::Unique<vk::Handle<(vk::HandleType)12>_>_>::operator()
            ((DefaultDeleter<vk::refdetails::Unique<vk::Handle<(vk::HandleType)12>_>_> *)
             &this->field_0x18,this->m_ptr);
  this->m_ptr = (Unique<vk::Handle<(vk::HandleType)12>_> *)0x0;
  return;
}

Assistant:

virtual void deletePtr (void) throw()
	{
		m_deleter(m_ptr);
		m_ptr = DE_NULL;
	}